

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

EStatusCode __thiscall CFFFileInput::ReadFDSelect(CFFFileInput *this,unsigned_short inFontIndex)

{
  CFFPrimitiveReader *this_00;
  ushort uVar1;
  EStatusCode EVar2;
  long inNewOffset;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  undefined6 in_register_00000032;
  int iVar6;
  bool bVar7;
  Byte fdIndex;
  Byte fdIndex_1;
  unsigned_short nextRangeGlyphIndex;
  unsigned_short firstGlyphIndex;
  unsigned_short rangesCount;
  Byte format;
  byte local_3a;
  byte local_39;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  Byte local_31;
  
  inNewOffset = GetSingleIntegerValue(this,inFontIndex,0xc25,0);
  if (inNewOffset == 0) {
    EVar2 = eFailure;
  }
  else {
    iVar6 = (int)CONCAT62(in_register_00000032,inFontIndex);
    uVar1 = *(ushort *)((long)&this->mCharStrings->mCharStringsCount + (ulong)(uint)(iVar6 << 4));
    pvVar3 = operator_new__((ulong)((uint)uVar1 * 8));
    *(void **)((long)&this->mTopDictIndex->mFDSelect + (ulong)(uint)(iVar6 * 0x50)) = pvVar3;
    this_00 = &this->mPrimitivesReader;
    CFFPrimitiveReader::SetOffset(this_00,inNewOffset);
    CFFPrimitiveReader::ReadCard8(this_00,&local_31);
    if (local_31 == '\0') {
      if ((ulong)uVar1 == 0) {
        EVar2 = eSuccess;
      }
      else {
        uVar5 = 1;
        do {
          EVar2 = CFFPrimitiveReader::ReadCard8(this_00,&local_39);
          if (EVar2 != eFailure) {
            *(ulong *)(*(long *)((long)&this->mTopDictIndex->mFDSelect + (ulong)(uint)(iVar6 * 0x50)
                                ) + -8 + uVar5 * 8) =
                 (ulong)local_39 * 0x80 + (ulong)local_39 * 8 +
                 *(long *)((long)&this->mTopDictIndex->mFDArray + (ulong)(uint)(iVar6 * 0x50));
          }
        } while ((EVar2 == eSuccess) && (bVar7 = uVar5 < uVar1, uVar5 = uVar5 + 1, bVar7));
      }
    }
    else {
      EVar2 = CFFPrimitiveReader::ReadCard16(this_00,&local_34);
      if (EVar2 == eFailure) {
        EVar2 = eFailure;
      }
      else {
        EVar2 = CFFPrimitiveReader::ReadCard16(this_00,&local_36);
        if ((EVar2 == eSuccess) && (local_34 != 0)) {
          uVar5 = 0;
          do {
            CFFPrimitiveReader::ReadCard8(this_00,&local_3a);
            CFFPrimitiveReader::ReadCard16(this_00,&local_38);
            EVar2 = CFFPrimitiveReader::GetInternalState(this_00);
            if (EVar2 != eFailure) {
              uVar4 = (ulong)local_36;
              if (local_36 < local_38) {
                do {
                  *(ulong *)(*(long *)((long)&this->mTopDictIndex->mFDSelect +
                                      (ulong)(uint)(iVar6 * 0x50)) + uVar4 * 8) =
                       *(long *)((long)&this->mTopDictIndex->mFDArray + (ulong)(uint)(iVar6 * 0x50))
                       + (ulong)local_3a * 0x80 + (ulong)local_3a * 8;
                  uVar4 = uVar4 + 1;
                } while (local_38 != uVar4);
              }
            }
            local_36 = local_38;
          } while ((EVar2 == eSuccess) && (uVar5 = uVar5 + 1, uVar5 < local_34));
        }
      }
    }
    if (EVar2 == eSuccess) {
      EVar2 = CFFPrimitiveReader::GetInternalState(this_00);
    }
  }
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadFDSelect(unsigned short inFontIndex)
{
	LongFilePositionType fdSelectLocation = GetFDSelectPosition(inFontIndex);
	unsigned short glyphCount = mCharStrings[inFontIndex].mCharStringsCount;
	EStatusCode status = PDFHummus::eSuccess;
	Byte format;

	// supposed to get here only for CIDs. and they must have an FDSelect...so if it doesn't - fail
	if(0 == fdSelectLocation)
		return PDFHummus::eFailure;

	mTopDictIndex[inFontIndex].mFDSelect = new FontDictInfo*[glyphCount];
	mPrimitivesReader.SetOffset(fdSelectLocation);

	mPrimitivesReader.ReadCard8(format);
	if(0 == format)
	{
		Byte fdIndex;

		for(unsigned long i=0; i < glyphCount && PDFHummus::eSuccess == status; ++i)
		{
			status = mPrimitivesReader.ReadCard8(fdIndex);
			if(status != PDFHummus::eFailure)
				mTopDictIndex[inFontIndex].mFDSelect[i] = mTopDictIndex[inFontIndex].mFDArray+ fdIndex;
		}
	}
	else // format 3
	{
		unsigned short rangesCount;
		unsigned short firstGlyphIndex;
		unsigned short nextRangeGlyphIndex;
		Byte fdIndex;

		status = mPrimitivesReader.ReadCard16(rangesCount);
		if(status != PDFHummus::eFailure)
		{
			status = mPrimitivesReader.ReadCard16(firstGlyphIndex);
			for(unsigned long i=0; i < rangesCount && PDFHummus::eSuccess == status;++i)
			{
				mPrimitivesReader.ReadCard8(fdIndex);
				mPrimitivesReader.ReadCard16(nextRangeGlyphIndex);
				status = mPrimitivesReader.GetInternalState();
				if(status != PDFHummus::eFailure)
					for(unsigned short j=firstGlyphIndex; j < nextRangeGlyphIndex;++j)
						mTopDictIndex[inFontIndex].mFDSelect[j] = 
							mTopDictIndex[inFontIndex].mFDArray + fdIndex;
				firstGlyphIndex = nextRangeGlyphIndex;
			}
		}
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}